

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O3

void Lf_ObjMergeOrder(Lf_Man_t *p,int iObj)

{
  float FlowRefs;
  float fVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  int *piVar6;
  Jf_Par_t *pJVar7;
  Gia_Man_t *pGVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uint *puVar11;
  Gia_Obj_t *pGVar12;
  word *pwVar13;
  Lf_Cut_t *pCutR;
  Lf_Cut_t *pLVar14;
  Vec_Mem_t *pVVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  Lf_Cut_t *pLVar19;
  Lf_Cut_t *pLVar20;
  Lf_Cut_t *pLVar21;
  ulong uVar22;
  byte bVar23;
  byte bVar24;
  int iVar25;
  uint fCompl1;
  int iVar26;
  long lVar27;
  long lVar28;
  int nSizeB;
  ulong uVar29;
  ulong uVar30;
  int iVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  int iVar37;
  Gia_Obj_t *pMux;
  Lf_Bst_t *pLVar38;
  ulong uVar39;
  uint uVar40;
  uint uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  long lVar45;
  int nCutNum;
  int iVar46;
  int iVar47;
  uint uVar48;
  int iVar49;
  int iVar50;
  word *pwVar51;
  Lf_Cut_t *pLVar52;
  int iVar53;
  bool bVar54;
  bool bVar55;
  bool bVar56;
  int local_17f4;
  uint local_17e8;
  int local_17d4;
  uint local_17c8;
  Lf_Cut_t *local_17c0;
  Lf_Cut_t *local_1770;
  Lf_Cut_t *local_1768;
  Lf_Cut_t *pCutsR [32];
  word uTruth [128];
  word local_1238 [128];
  word uTruth0 [128];
  word CutSet [32] [10];
  
  pLVar19 = (Lf_Cut_t *)CutSet;
  memset(pLVar19,0,0xa00);
  if ((iObj < 0) || (p->pGia->nObjs <= iObj)) goto LAB_00733f41;
  uVar4 = (p->vOffsets).nSize;
  if ((int)uVar4 <= iObj) goto LAB_00733e2a;
  piVar6 = (p->vOffsets).pArray;
  iVar26 = piVar6[(uint)iObj];
  lVar27 = (long)iVar26;
  if ((lVar27 < 0) || ((p->vFlowRefs).nSize <= iVar26)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecFlt.h"
                  ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
  }
  if ((p->vRequired).nSize <= iObj) goto LAB_00733e2a;
  pMux = p->pGia->pObjs + (uint)iObj;
  pJVar7 = p->pPars;
  uVar5 = pJVar7->nLutSize / 2;
  if (pJVar7->fCutGroup == 0) {
    uVar5 = pJVar7->nLutSize;
  }
  uVar43 = (ulong)uVar5;
  uVar22 = *(ulong *)pMux;
  uVar32 = iObj - ((uint)uVar22 & 0x1fffffff);
  if (((int)uVar32 < 0) || (uVar4 <= uVar32)) goto LAB_00733e2a;
  FlowRefs = (p->vFlowRefs).pArray[lVar27];
  local_17d4 = (p->vRequired).pArray[(uint)iObj];
  uVar4 = pJVar7->nCutNum;
  lVar28 = (long)p->nCutWords;
  pLVar38 = p->pObjBests + lVar27;
  if (piVar6[uVar32] == -1) {
    Lf_ManPrepareSet_CutTemp._16_4_ = 2;
    Lf_ManPrepareSet_CutTemp._20_4_ = Lf_ManPrepareSet_CutTemp._20_4_ & 0x3fffff | 0x1000000;
    Lf_ManPrepareSet_CutTemp._0_8_ = 1L << ((byte)uVar32 & 0x3f);
    local_17c0 = (Lf_Cut_t *)Lf_ManPrepareSet_CutTemp;
    local_17e8 = 1;
    Lf_ManPrepareSet_CutTemp._24_4_ = uVar32;
  }
  else {
    local_17c0 = Lf_ManFetchSet(p,uVar32);
    if ((int)uVar4 < 1) {
      local_17e8 = 0;
    }
    else {
      local_17e8 = 0;
      pLVar20 = local_17c0;
      uVar32 = local_17e8;
      do {
        local_17e8 = uVar32;
        if (0xfeffffff < *(uint *)&pLVar20->field_0x14) break;
        pLVar20 = (Lf_Cut_t *)(&pLVar20->Sign + p->nCutWords);
        uVar32 = local_17e8 + 1;
        local_17e8 = uVar4;
      } while (uVar4 != uVar32);
    }
  }
  uVar32 = iObj - (*(uint *)&pMux->field_0x4 & 0x1fffffff);
  if (((int)uVar32 < 0) || ((p->vOffsets).nSize <= (int)uVar32)) goto LAB_00733e2a;
  if ((p->vOffsets).pArray[uVar32] == -1) {
    Lf_ManPrepareSet_CutTemp._96_4_ = 2;
    Lf_ManPrepareSet_CutTemp._100_4_ = Lf_ManPrepareSet_CutTemp._100_4_ & 0x3fffff | 0x1000000;
    Lf_ManPrepareSet_CutTemp._80_8_ = 1L << ((byte)uVar32 & 0x3f);
    local_17f4 = 1;
    local_1770 = (Lf_Cut_t *)(Lf_ManPrepareSet_CutTemp + 0x50);
    Lf_ManPrepareSet_CutTemp._104_4_ = uVar32;
  }
  else {
    iVar26 = p->pPars->nCutNum;
    local_1770 = Lf_ManFetchSet(p,uVar32);
    if (iVar26 < 1) {
      local_17f4 = 0;
    }
    else {
      local_17f4 = 0;
      pLVar20 = local_1770;
      iVar25 = local_17f4;
      do {
        local_17f4 = iVar25;
        if (0xfeffffff < *(uint *)&pLVar20->field_0x14) break;
        pLVar20 = (Lf_Cut_t *)(&pLVar20->Sign + p->nCutWords);
        iVar25 = local_17f4 + 1;
        local_17f4 = iVar26;
      } while (iVar26 != iVar25);
    }
  }
  piVar6 = p->pGia->pSibls;
  if (piVar6 == (int *)0x0) {
    uVar32 = 0;
  }
  else {
    uVar32 = piVar6[(uint)iObj];
  }
  uVar33 = (uint)*(undefined8 *)pMux;
  if (((-1 < (int)uVar33) && (uVar33 = uVar33 & 0x1fffffff, uVar33 != 0x1fffffff)) &&
     (uVar33 == ((uint)((ulong)*(undefined8 *)pMux >> 0x20) & 0x1fffffff))) {
    __assert_fail("!Gia_ObjIsBuf(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                  ,0x4b5,"void Lf_ObjMergeOrder(Lf_Man_t *, int)");
  }
  if (0 < (int)uVar4) {
    uVar29 = 0;
    do {
      pCutsR[uVar29] = pLVar19;
      uVar29 = uVar29 + 1;
      pLVar19 = (Lf_Cut_t *)(&pLVar19->Sign + lVar28);
    } while (uVar4 != uVar29);
  }
  pLVar19 = pCutsR[0];
  if (p->Iter == 0) {
    uVar33 = 0;
  }
  else {
    Lf_MemLoadCut(&p->vStoreOld,(uint)pLVar38->Cut[0] >> 1,iObj,pCutsR[0],p->pPars->fCutMin,1);
    if (1 < ((uint)pLVar38->Cut[0] ^ (uint)pLVar38->Cut[1])) {
      Lf_MemLoadCut(&p->vStoreOld,(uint)pLVar38->Cut[1] >> 1,iObj,pCutsR[1],p->pPars->fCutMin,1);
    }
    if (p->fUseEla != 0) {
      if ((p->vOffsets).nSize <= iObj) goto LAB_00733e2a;
      iVar26 = (p->vOffsets).pArray[(uint)iObj];
      if (((long)iVar26 < 0) || ((p->vMapRefs).nSize <= iVar26)) goto LAB_00733e2a;
      if (0 < (p->vMapRefs).pArray[iVar26]) {
        Lf_CutDeref_rec(p,pCutsR[(uint)pLVar38->Cut[1] & 1]);
      }
    }
    if (local_17d4 == 1000000000) {
      if (*(uint *)&pLVar19->field_0x14 < 0x1000000) {
        iVar26 = 2;
        local_17d4 = 1;
      }
      else {
        uVar29 = 0;
        iVar26 = 0;
        local_17d4 = 0;
        do {
          uVar33 = *(uint *)((long)&pLVar19[1].Sign + uVar29 * 4);
          lVar27 = (long)(int)uVar33;
          if ((lVar27 < 0) || ((p->vOffsets).nSize <= (int)uVar33)) goto LAB_00733e2a;
          lVar45 = (long)(p->vOffsets).pArray[lVar27];
          if (lVar45 < 0) {
            if (p->pGia->nObjs <= (int)uVar33) goto LAB_00733f41;
            iVar25 = Lf_ObjArrival_rec(p,p->pGia->pObjs + lVar27);
            uVar33 = *(uint *)((long)&pLVar19[1].Sign + uVar29 * 4);
            if (local_17d4 <= iVar25) {
              local_17d4 = iVar25;
            }
            if ((int)uVar33 < 0) goto LAB_00733e2a;
          }
          else {
            iVar25 = p->pObjBests[lVar45].Delay[0];
            if (local_17d4 <= iVar25) {
              local_17d4 = iVar25;
            }
          }
          if ((p->vRequired).nSize <= (int)uVar33) goto LAB_00733e2a;
          iVar25 = (p->vRequired).pArray[uVar33];
          iVar46 = iVar25;
          if (iVar25 < iVar26) {
            iVar46 = iVar26;
          }
          if (iVar25 < 1000000000) {
            iVar26 = iVar46;
          }
          uVar29 = uVar29 + 1;
        } while (uVar29 < (byte)pLVar19->field_0x17);
        iVar26 = iVar26 + 2;
        local_17d4 = local_17d4 + 1;
      }
      if (local_17d4 < iVar26) {
        local_17d4 = iVar26;
      }
    }
    Lf_CutParams(p,pLVar19,local_17d4,FlowRefs,pMux);
    uVar33 = 1;
    if (1 < ((uint)pLVar38->Cut[1] ^ (uint)pLVar38->Cut[0])) {
      Lf_CutParams(p,pCutsR[1],local_17d4,FlowRefs,pMux);
      uVar33 = Lf_SetAddCut(pCutsR,1,uVar4);
      pLVar19 = pCutsR[0];
    }
    if ((pLVar19->field_0x16 & 0x40) != 0) {
      p->nTimeFails = p->nTimeFails + 1;
    }
  }
  if (uVar32 == 0) goto LAB_00732190;
  pGVar8 = p->pGia;
  iVar26 = pGVar8->pSibls[(uint)iObj];
  if (((long)iVar26 < 0) || (pGVar8->nObjs <= iVar26)) goto LAB_00733f41;
  if (((int)uVar32 < 0) || ((p->vOffsets).nSize <= (int)uVar32)) goto LAB_00733e2a;
  uVar9 = *(undefined8 *)(pGVar8->pObjs + iVar26);
  uVar10 = *(undefined8 *)pMux;
  if ((p->vOffsets).pArray[uVar32] == -1) {
    Lf_ManPrepareSet_CutTemp._176_4_ = 2;
    Lf_ManPrepareSet_CutTemp._180_4_ = Lf_ManPrepareSet_CutTemp._180_4_ & 0x3fffff | 0x1000000;
    Lf_ManPrepareSet_CutTemp._160_8_ = 1L << ((byte)uVar32 & 0x3f);
    pLVar19 = (Lf_Cut_t *)(Lf_ManPrepareSet_CutTemp + 0xa0);
    iVar26 = 1;
    Lf_ManPrepareSet_CutTemp._184_4_ = uVar32;
LAB_007320ef:
    do {
      if ((uint)pLVar19[1].Sign != uVar32) {
        pLVar20 = pCutsR[(int)uVar33];
        memcpy(pLVar20,pLVar19,lVar28 * 8);
        if (-1 < pLVar20->iFunc) {
          local_17c8 = ((uint)((ulong)uVar9 >> 0x20) ^ (uint)((ulong)uVar10 >> 0x20)) >> 0x1f;
          pLVar20->iFunc = pLVar20->iFunc ^ local_17c8;
        }
        Lf_CutParams(p,pLVar20,local_17d4,FlowRefs,pMux);
        uVar33 = Lf_SetAddCut(pCutsR,uVar33,uVar4);
      }
      pLVar19 = (Lf_Cut_t *)(&pLVar19->Sign + lVar28);
      iVar26 = iVar26 + -1;
    } while (iVar26 != 0);
  }
  else {
    iVar25 = p->pPars->nCutNum;
    pLVar19 = Lf_ManFetchSet(p,uVar32);
    if (0 < iVar25) {
      iVar46 = 0;
      pLVar20 = pLVar19;
      do {
        iVar26 = iVar46;
        if (0xfeffffff < *(uint *)&pLVar20->field_0x14) break;
        pLVar20 = (Lf_Cut_t *)(&pLVar20->Sign + p->nCutWords);
        iVar46 = iVar46 + 1;
        iVar26 = iVar25;
      } while (iVar25 != iVar46);
      if (0 < iVar26) goto LAB_007320ef;
    }
  }
LAB_00732190:
  uVar32 = (uint)(uVar22 >> 0x1d) & 1;
  fCompl1 = (uint)(uVar22 >> 0x3d) & 1;
  pGVar8 = p->pGia;
  puVar11 = pGVar8->pMuxes;
  if ((puVar11 == (uint *)0x0) || (uVar34 = puVar11[(uint)iObj], uVar34 == 0)) {
    uVar34 = (uint)*(undefined8 *)pMux;
    bVar56 = (~uVar34 & 0x1fffffff) != 0;
    bVar54 = (uVar34 & 0x1fffffff) < ((uint)((ulong)*(undefined8 *)pMux >> 0x20) & 0x1fffffff);
    p->CutCount[0] = (double)(int)(local_17f4 * local_17e8) + p->CutCount[0];
    if (0 < (int)local_17e8) {
      iVar26 = 1 << ((char)uVar5 - 6U & 0x1f);
      if ((int)uVar5 < 7) {
        iVar26 = 1;
      }
      uVar16 = 0;
      do {
        if (((int)(uint)(byte)local_17c0->field_0x17 <= (int)uVar5) && (0 < local_17f4)) {
          iVar25 = 0;
          pLVar19 = local_1770;
          do {
            uVar18 = *(uint *)&pLVar19->field_0x14 >> 0x18;
            if (((int)uVar18 <= (int)uVar5) &&
               (((byte)local_17c0->field_0x17 + uVar18 <= uVar5 ||
                (uVar22 = pLVar19->Sign | local_17c0->Sign,
                uVar22 = uVar22 - (uVar22 >> 1 & 0x5555555555555555),
                uVar22 = (uVar22 >> 2 & 0x3333333333333333) + (uVar22 & 0x3333333333333333),
                (byte)(((uVar22 >> 4) + uVar22 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) <=
                uVar5)))) {
              p->CutCount[1] = p->CutCount[1] + 1.0;
              pLVar52 = pCutsR[(int)uVar33];
              uVar18 = *(uint *)&local_17c0->field_0x14;
              uVar41 = uVar18 >> 0x18;
              uVar48 = *(uint *)&pLVar19->field_0x14 >> 0x18;
              pLVar20 = pLVar52 + 1;
              if ((uVar41 == uVar5) && (uVar48 == uVar5)) {
                if (0xffffff < uVar18) {
                  uVar22 = 0;
                  do {
                    iVar46 = *(int *)((long)&local_17c0[1].Sign + uVar22 * 4);
                    if (iVar46 != *(int *)((long)&pLVar19[1].Sign + uVar22 * 4)) goto LAB_00732f58;
                    *(int *)((long)&pLVar20->Sign + uVar22 * 4) = iVar46;
                    uVar22 = uVar22 + 1;
                  } while (uVar43 != uVar22);
                }
                uVar18 = *(uint *)&pLVar52->field_0x14 & 0xffffff | uVar5 << 0x18;
                *(uint *)&pLVar52->field_0x14 = uVar18;
                pLVar52->iFunc = -1;
LAB_00732577:
                uVar22 = pLVar19->Sign | local_17c0->Sign;
                pLVar52->Sign = uVar22;
                if (0 < (int)uVar33) {
                  uVar41 = uVar18 >> 0x18;
                  uVar29 = 0;
                  do {
                    pLVar21 = pCutsR[uVar29];
                    uVar48 = *(uint *)&pLVar21->field_0x14 >> 0x18;
                    if ((uVar48 <= uVar41) && ((pLVar21->Sign & ~uVar22) == 0)) {
                      if (uVar41 == uVar48) {
                        if (uVar18 < 0x1000000) goto LAB_00732f58;
                        uVar42 = 0;
                        while (*(int *)((long)&pLVar20->Sign + uVar42 * 4) ==
                               *(int *)((long)&pLVar21[1].Sign + uVar42 * 4)) {
                          uVar42 = uVar42 + 1;
                          if (uVar41 == uVar42) goto LAB_00732f58;
                        }
                      }
                      else {
                        if (uVar41 <= uVar48) goto LAB_00733d70;
                        if (*(uint *)&pLVar21->field_0x14 < 0x1000000) goto LAB_00732f58;
                        uVar42 = 0;
                        uVar40 = 0;
                        do {
                          iVar46 = *(int *)((long)&pLVar21[1].Sign + (long)(int)uVar40 * 4);
                          iVar49 = *(int *)((long)&pLVar20->Sign + uVar42 * 4);
                          if (iVar46 < iVar49) break;
                          if ((iVar49 == iVar46) && (uVar40 = uVar40 + 1, uVar40 == uVar48))
                          goto LAB_00732f58;
                          uVar42 = uVar42 + 1;
                        } while (uVar41 != uVar42);
                      }
                    }
                    uVar29 = uVar29 + 1;
                  } while (uVar29 != uVar33);
                }
                p->CutCount[2] = p->CutCount[2] + 1.0;
                if (p->pPars->fCutMin != 0) {
                  iVar46 = p->pPars->nLutSize;
                  if (iVar46 < 7) {
                    uVar18 = local_17c0->iFunc;
                    if ((int)uVar18 < 0) goto LAB_00733dcd;
                    pVVar15 = p->vTtMem;
                    uVar41 = uVar18 >> 1;
                    if (pVVar15->nEntries <= (int)uVar41) goto LAB_00733dec;
                    bVar23 = (byte)pVVar15->LogPageSze;
                    uVar48 = pLVar19->iFunc;
                    if ((int)uVar48 < 0) goto LAB_00733dcd;
                    uVar40 = uVar48 >> 1;
                    if ((uint)pVVar15->nEntries <= uVar40) goto LAB_00733dec;
                    uVar36 = *(uint *)&pLVar52->field_0x14;
                    uVar35 = uVar36 >> 0x18;
                    uVar22 = (ulong)uVar35;
                    uVar29 = -(ulong)((uVar18 & 1) != uVar32) ^
                             pVVar15->ppPages[uVar41 >> (bVar23 & 0x1f)]
                             [(int)((uVar41 & pVVar15->PageMask) * pVVar15->nEntrySize)];
                    uVar42 = -(ulong)((uVar48 & 1) != fCompl1) ^
                             pVVar15->ppPages[uVar40 >> (bVar23 & 0x1f)]
                             [(int)((uVar40 & pVVar15->PageMask) * pVVar15->nEntrySize)];
                    uVar18 = (*(uint *)&local_17c0->field_0x14 >> 0x18) - 1;
                    if ((0xffffff < uVar36) && (0xffffff < *(uint *)&local_17c0->field_0x14)) {
                      lVar27 = uVar22 * 0x18 + 0xa03ec8;
                      uVar39 = uVar22;
                      do {
                        uVar30 = uVar39 - 1;
                        uVar44 = (ulong)uVar18;
                        iVar46 = *(int *)((long)&local_17c0[1].Sign + uVar44 * 4);
                        if (*(int *)(&pLVar52->field_0x14 + uVar39 * 4) <= iVar46) {
                          if (*(int *)(&pLVar52->field_0x14 + uVar39 * 4) != iVar46)
                          goto LAB_00733d8f;
                          if (uVar44 < uVar30) {
                            bVar23 = (char)(-1 << ((byte)uVar18 & 0x1f)) +
                                     (char)(1 << ((byte)uVar30 & 0x1f));
                            lVar45 = uVar44 * 0x90;
                            uVar29 = (uVar29 & *(ulong *)(lVar27 + lVar45)) >> (bVar23 & 0x3f) |
                                     (*(ulong *)(lVar27 + -8 + lVar45) & uVar29) << (bVar23 & 0x3f)
                                     | *(ulong *)(lVar27 + -0x10 + lVar45) & uVar29;
                          }
                          uVar18 = uVar18 - 1;
                        }
                      } while ((1 < uVar39) &&
                              (lVar27 = lVar27 + -0x18, uVar39 = uVar30, -1 < (int)uVar18));
                    }
                    if (uVar18 != 0xffffffff) {
LAB_00733e87:
                      __assert_fail("k == -1",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                                    ,0x63b,"word Abc_Tt6Expand(word, int *, int, int *, int)");
                    }
                    uVar18 = (*(uint *)&pLVar19->field_0x14 >> 0x18) - 1;
                    if ((0xffffff < uVar36) && (0xffffff < *(uint *)&pLVar19->field_0x14)) {
                      lVar27 = uVar22 * 0x18 + 0xa03ec8;
                      uVar39 = uVar22;
                      do {
                        uVar30 = uVar39 - 1;
                        uVar44 = (ulong)uVar18;
                        iVar46 = *(int *)((long)&pLVar19[1].Sign + uVar44 * 4);
                        if (*(int *)(&pLVar52->field_0x14 + uVar39 * 4) <= iVar46) {
                          if (*(int *)(&pLVar52->field_0x14 + uVar39 * 4) != iVar46) {
LAB_00733d8f:
                            __assert_fail("pCut[i] == pCut0[k]",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                                          ,0x636,"word Abc_Tt6Expand(word, int *, int, int *, int)")
                            ;
                          }
                          if (uVar44 < uVar30) {
                            bVar23 = (char)(-1 << ((byte)uVar18 & 0x1f)) +
                                     (char)(1 << ((byte)uVar30 & 0x1f));
                            lVar45 = uVar44 * 0x90;
                            uVar42 = (uVar42 & *(ulong *)(lVar27 + lVar45)) >> (bVar23 & 0x3f) |
                                     (*(ulong *)(lVar27 + -8 + lVar45) & uVar42) << (bVar23 & 0x3f)
                                     | *(ulong *)(lVar27 + -0x10 + lVar45) & uVar42;
                          }
                          uVar18 = uVar18 - 1;
                        }
                      } while ((1 < uVar39) &&
                              (lVar27 = lVar27 + -0x18, uVar39 = uVar30, -1 < (int)uVar18));
                    }
                    if (uVar18 != 0xffffffff) goto LAB_00733e87;
                    uVar39 = uVar42 & uVar29;
                    if ((bVar56 && -1 < (int)uVar34) && bVar54) {
                      uVar39 = uVar42 ^ uVar29;
                    }
                    uVar18 = (uint)uVar39 & 1;
                    uTruth[0] = -(ulong)uVar18 ^ uVar39;
                    uVar41 = 0;
                    uVar29 = uTruth[0];
                    if (0xffffff < uVar36) {
                      uVar42 = 0;
                      lVar27 = 0xa03ed8;
                      pwVar51 = s_Truths6Neg;
                      uVar41 = 0;
                      do {
                        bVar23 = (byte)(1 << ((byte)uVar42 & 0x1f));
                        if ((*pwVar51 & (uVar29 >> (bVar23 & 0x3f) ^ uVar29)) != 0) {
                          lVar45 = (long)(int)uVar41;
                          if (lVar45 < (long)uVar42) {
                            *(int *)((long)&pLVar20->Sign + lVar45 * 4) =
                                 *(int *)((long)&pLVar20->Sign + uVar42 * 4);
                            bVar23 = (char)(-1 << ((byte)uVar41 & 0x1f)) + bVar23;
                            lVar45 = lVar45 * 0x90;
                            uVar29 = (uVar29 & *(ulong *)(lVar27 + 8 + lVar45)) >> (bVar23 & 0x3f) |
                                     (*(ulong *)(lVar27 + lVar45) & uVar29) << (bVar23 & 0x3f) |
                                     *(ulong *)(lVar27 + -8 + lVar45) & uVar29;
                          }
                          uVar41 = uVar41 + 1;
                        }
                        uVar42 = uVar42 + 1;
                        pwVar51 = pwVar51 + 1;
                        lVar27 = lVar27 + 0x18;
                      } while (uVar22 != uVar42);
                    }
                    uVar22 = uTruth[0];
                    if ((uVar41 != uVar35) && (uVar22 = uVar29, (int)uVar35 <= (int)uVar41)) {
                      __assert_fail("k < nVars",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                                    ,0x65d,"int Abc_Tt6MinBase(word *, int *, int)");
                    }
                    pLVar52->field_0x17 = (char)uVar41;
                    uTruth[0] = uVar22;
                    if ((uVar22 & 1) != 0) {
                      __assert_fail("(int)(t & 1) == 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                                    ,0x3d1,
                                    "int Lf_CutComputeTruth6(Lf_Man_t *, Lf_Cut_t *, Lf_Cut_t *, int, int, Lf_Cut_t *, int)"
                                   );
                    }
                    iVar46 = Vec_MemHashInsert(p->vTtMem,uTruth);
                    if (iVar46 < 0) {
LAB_00733ea6:
                      __assert_fail("Var >= 0 && !(c >> 1)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                                    ,0x12e,"int Abc_Var2Lit(int, int)");
                    }
                    pLVar52->iFunc = uVar18 + iVar46 * 2;
                    uVar18 = *(uint *)&pLVar52->field_0x14 >> 0x18;
                    bVar55 = uVar18 < uVar35;
                    if (uVar35 < uVar18) {
                      __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                                    ,0x3d5,
                                    "int Lf_CutComputeTruth6(Lf_Man_t *, Lf_Cut_t *, Lf_Cut_t *, int, int, Lf_Cut_t *, int)"
                                   );
                    }
                  }
                  else {
                    iVar49 = iVar46 + -6;
                    uVar41 = 1 << ((byte)iVar49 & 0x1f);
                    uVar18 = local_17c0->iFunc;
                    if ((int)uVar18 < 0) goto LAB_00733dcd;
                    pVVar15 = p->vTtMem;
                    uVar48 = uVar18 >> 1;
                    if (pVVar15->nEntries <= (int)uVar48) {
LAB_00733dec:
                      __assert_fail("i >= 0 && i < p->nEntries",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecMem.h"
                                    ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
                    }
                    bVar23 = (byte)pVVar15->LogPageSze;
                    uVar40 = pLVar19->iFunc;
                    if ((int)uVar40 < 0) goto LAB_00733dcd;
                    uVar36 = uVar40 >> 1;
                    if ((uint)pVVar15->nEntries <= uVar36) goto LAB_00733dec;
                    uVar35 = *(uint *)&pLVar52->field_0x14;
                    iVar17 = (uVar48 & pVVar15->PageMask) * pVVar15->nEntrySize;
                    pwVar51 = pVVar15->ppPages[uVar48 >> (bVar23 & 0x1f)];
                    iVar37 = (uVar36 & pVVar15->PageMask) * pVVar15->nEntrySize;
                    pwVar13 = pVVar15->ppPages[uVar36 >> (bVar23 & 0x1f)];
                    if ((uVar18 & 1) == uVar32) {
                      if (iVar49 != 0x1f) {
                        uVar22 = 0;
                        do {
                          uTruth0[uVar22] = pwVar51[(long)iVar17 + uVar22];
                          uVar22 = uVar22 + 1;
                        } while (uVar41 != uVar22);
                      }
                    }
                    else if (iVar49 != 0x1f) {
                      uVar22 = 0;
                      do {
                        uTruth0[uVar22] = ~pwVar51[(long)iVar17 + uVar22];
                        uVar22 = uVar22 + 1;
                      } while (uVar41 != uVar22);
                    }
                    if ((uVar40 & 1) == fCompl1) {
                      if (iVar49 != 0x1f) {
                        uVar22 = 0;
                        do {
                          local_1238[uVar22] = pwVar13[(long)iVar37 + uVar22];
                          uVar22 = uVar22 + 1;
                        } while (uVar41 != uVar22);
                      }
                    }
                    else if (iVar49 != 0x1f) {
                      uVar22 = 0;
                      do {
                        local_1238[uVar22] = ~pwVar13[(long)iVar37 + uVar22];
                        uVar22 = uVar22 + 1;
                      } while (uVar41 != uVar22);
                    }
                    uVar18 = uVar35 >> 0x18;
                    uVar22 = (ulong)uVar18;
                    uVar48 = (*(uint *)&local_17c0->field_0x14 >> 0x18) - 1;
                    if ((0xffffff < uVar35) && (0xffffff < *(uint *)&local_17c0->field_0x14)) {
                      do {
                        uVar29 = uVar22 - 1;
                        iVar17 = *(int *)((long)&local_17c0[1].Sign + (ulong)uVar48 * 4);
                        if (*(int *)(&pLVar52->field_0x14 + uVar22 * 4) <= iVar17) {
                          if (*(int *)(&pLVar52->field_0x14 + uVar22 * 4) != iVar17)
                          goto LAB_00733dae;
                          if (uVar48 < uVar29) {
                            Abc_TtSwapVars(uTruth0,iVar46,uVar48,(int)uVar29);
                          }
                          uVar48 = uVar48 - 1;
                        }
                      } while ((1 < uVar22) && (uVar22 = uVar29, -1 < (int)uVar48));
                    }
                    if (uVar48 != 0xffffffff) {
LAB_00733e68:
                      __assert_fail("k == -1",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                                    ,0x64a,"void Abc_TtExpand(word *, int, int *, int, int *, int)")
                      ;
                    }
                    uVar48 = (*(uint *)&pLVar19->field_0x14 >> 0x18) - 1;
                    if ((0xffffff < *(uint *)&pLVar19->field_0x14) &&
                       (0xffffff < *(uint *)&pLVar52->field_0x14)) {
                      uVar22 = (ulong)(*(uint *)&pLVar52->field_0x14 >> 0x18);
                      do {
                        uVar29 = uVar22 - 1;
                        iVar17 = *(int *)((long)&pLVar19[1].Sign + (ulong)uVar48 * 4);
                        if (*(int *)(&pLVar52->field_0x14 + uVar22 * 4) <= iVar17) {
                          if (*(int *)(&pLVar52->field_0x14 + uVar22 * 4) != iVar17) {
LAB_00733dae:
                            __assert_fail("pCut[i] == pCut0[k]",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                                          ,0x645,
                                          "void Abc_TtExpand(word *, int, int *, int, int *, int)");
                          }
                          if (uVar48 < uVar29) {
                            Abc_TtSwapVars(local_1238,iVar46,uVar48,(int)uVar29);
                          }
                          uVar48 = uVar48 - 1;
                        }
                      } while ((1 < uVar22) && (uVar22 = uVar29, -1 < (int)uVar48));
                    }
                    if (uVar48 != 0xffffffff) goto LAB_00733e68;
                    if ((bVar56 && -1 < (int)uVar34) && bVar54) {
                      uVar48 = ((uint)local_1238[0] ^ (uint)uTruth0[0]) & 1;
                      if (uVar48 == 0) {
                        uVar40 = 0;
                        if (iVar49 != 0x1f) {
                          uVar22 = 0;
                          do {
                            uTruth[uVar22] = local_1238[uVar22] ^ uTruth0[uVar22];
                            uVar22 = uVar22 + 1;
                          } while (uVar41 != uVar22);
                        }
                      }
                      else {
                        uVar40 = 1;
                        if (iVar49 != 0x1f) {
                          uVar22 = 0;
                          do {
                            uTruth[uVar22] = ~(uTruth0[uVar22] ^ local_1238[uVar22]);
                            uVar22 = uVar22 + 1;
                            uVar40 = uVar48;
                          } while (uVar41 != uVar22);
                        }
                      }
                    }
                    else {
                      uVar48 = (uint)local_1238[0] & (uint)uTruth0[0] & 1;
                      if (uVar48 == 0) {
                        uVar40 = 0;
                        if (iVar49 != 0x1f) {
                          uVar22 = 0;
                          do {
                            uTruth[uVar22] = local_1238[uVar22] & uTruth0[uVar22];
                            uVar22 = uVar22 + 1;
                          } while (uVar41 != uVar22);
                        }
                      }
                      else {
                        uVar40 = 1;
                        if (iVar49 != 0x1f) {
                          uVar22 = 0;
                          do {
                            uTruth[uVar22] = ~(local_1238[uVar22] & uTruth0[uVar22]);
                            uVar22 = uVar22 + 1;
                            uVar40 = uVar48;
                          } while (uVar41 != uVar22);
                        }
                      }
                    }
                    iVar46 = Abc_TtMinBase(uTruth,(int *)pLVar20,(uint)(byte)pLVar52->field_0x17,
                                           iVar46);
                    pLVar52->field_0x17 = (char)iVar46;
                    if ((uTruth[0] & 1) != 0) {
                      __assert_fail("(uTruth[0] & 1) == 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                                    ,0x3ed,
                                    "int Lf_CutComputeTruth(Lf_Man_t *, Lf_Cut_t *, Lf_Cut_t *, int, int, Lf_Cut_t *, int)"
                                   );
                    }
                    iVar46 = Vec_MemHashInsert(p->vTtMem,uTruth);
                    if (iVar46 < 0) goto LAB_00733ea6;
                    pLVar52->iFunc = uVar40 + iVar46 * 2;
                    uVar41 = *(uint *)&pLVar52->field_0x14 >> 0x18;
                    bVar55 = uVar41 < uVar18;
                    if (!bVar55 && uVar41 != uVar18) {
                      __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                                    ,0x3f1,
                                    "int Lf_CutComputeTruth(Lf_Man_t *, Lf_Cut_t *, Lf_Cut_t *, int, int, Lf_Cut_t *, int)"
                                   );
                    }
                  }
                  if (bVar55) {
                    if (*(uint *)&pLVar52->field_0x14 < 0x1000000) {
                      uVar22 = 0;
                    }
                    else {
                      uVar29 = 0;
                      uVar22 = 0;
                      do {
                        uVar22 = uVar22 | 1L << ((ulong)*(byte *)((long)&pLVar20->Sign + uVar29 * 4)
                                                & 0x3f);
                        uVar29 = uVar29 + 1;
                      } while (*(uint *)&pLVar52->field_0x14 >> 0x18 != uVar29);
                    }
                    pLVar52->Sign = uVar22;
                  }
                }
                uVar18 = p->pPars->nLutSizeMux;
                if ((uVar18 != 0) && (uVar18 == (byte)pLVar52->field_0x17)) {
                  if (pLVar52->iFunc < 0) goto LAB_00733dcd;
                  pVVar15 = p->vTtMem;
                  uVar41 = (uint)pLVar52->iFunc >> 1;
                  if (pVVar15->nEntries <= (int)uVar41) goto LAB_00733dec;
                  iVar46 = Lf_ManFindCofVar(pVVar15->ppPages
                                            [uVar41 >> ((byte)pVVar15->LogPageSze & 0x1f)] +
                                            (ulong)(uVar41 & pVVar15->PageMask) *
                                            (long)pVVar15->nEntrySize,iVar26,uVar18);
                  if (iVar46 == -1) goto LAB_00732f58;
                }
                Lf_CutParams(p,pLVar52,local_17d4,FlowRefs,pMux);
                uVar33 = Lf_SetAddCut(pCutsR,uVar33,uVar4);
              }
              else {
                iVar46 = 0;
                uVar22 = 0;
                if (uVar18 < 0x1000000) {
LAB_007324c0:
                  if ((int)((int)uVar22 + uVar48) <= (int)(iVar46 + uVar5)) {
                    if (iVar46 < (int)uVar48) {
                      uVar22 = (ulong)(int)uVar22;
                      uVar29 = (ulong)iVar46;
                      do {
                        lVar27 = uVar29 * 4;
                        uVar29 = uVar29 + 1;
                        *(int *)((long)&pLVar20->Sign + uVar22 * 4) =
                             *(int *)((long)&pLVar19[1].Sign + lVar27);
                        uVar22 = uVar22 + 1;
                      } while (uVar48 != uVar29);
                    }
                    uVar18 = *(uint *)&pLVar52->field_0x14 & 0x7fffff | (int)uVar22 << 0x18;
                    pLVar52->iFunc = -1;
                    *(uint *)&pLVar52->field_0x14 = uVar18;
                    goto LAB_00732577;
                  }
                }
                else {
                  iVar49 = 0;
                  uVar22 = 0;
                  if (*(uint *)&pLVar19->field_0x14 < 0x1000000) {
LAB_00732524:
                    if ((int)((int)uVar22 + uVar41) <= (int)(iVar49 + uVar5)) {
                      if (iVar49 < (int)uVar41) {
                        uVar22 = (ulong)(int)uVar22;
                        uVar29 = (ulong)iVar49;
                        do {
                          lVar27 = uVar29 * 4;
                          uVar29 = uVar29 + 1;
                          *(int *)((long)&pLVar20->Sign + uVar22 * 4) =
                               *(int *)((long)&local_17c0[1].Sign + lVar27);
                          uVar22 = uVar22 + 1;
                        } while (uVar41 != uVar29);
                      }
                      uVar18 = *(uint *)&pLVar52->field_0x14 & 0x7fffff | (int)uVar22 << 0x18;
                      pLVar52->iFunc = -1;
                      *(uint *)&pLVar52->field_0x14 = uVar18;
                      goto LAB_00732577;
                    }
                  }
                  else if (uVar5 != 0) {
                    uVar22 = 0;
                    iVar49 = 0;
                    iVar17 = 0;
                    do {
                      iVar46 = *(int *)((long)&local_17c0[1].Sign + (long)iVar49 * 4);
                      iVar37 = *(int *)((long)&pLVar19[1].Sign + (long)iVar17 * 4);
                      if (iVar46 < iVar37) {
                        iVar49 = iVar49 + 1;
                        *(int *)((long)&pLVar20->Sign + uVar22 * 4) = iVar46;
                        iVar46 = iVar17;
                        if ((int)uVar41 <= iVar49) {
LAB_00732c6b:
                          uVar22 = (ulong)((int)uVar22 + 1);
                          goto LAB_007324c0;
                        }
                      }
                      else {
                        if (iVar37 < iVar46) {
                          *(int *)((long)&pLVar20->Sign + uVar22 * 4) = iVar37;
                        }
                        else {
                          iVar49 = iVar49 + 1;
                          *(int *)((long)&pLVar20->Sign + uVar22 * 4) = iVar46;
                          iVar46 = iVar17 + 1;
                          if ((int)uVar41 <= iVar49) goto LAB_00732c6b;
                        }
                        iVar17 = iVar17 + 1;
                        if ((int)uVar48 <= iVar17) {
                          uVar22 = (ulong)((int)uVar22 + 1);
                          goto LAB_00732524;
                        }
                      }
                      uVar22 = uVar22 + 1;
                    } while (uVar43 != uVar22);
                  }
                }
              }
            }
LAB_00732f58:
            pLVar19 = (Lf_Cut_t *)(&pLVar19->Sign + lVar28);
            iVar25 = iVar25 + 1;
          } while (iVar25 != local_17f4);
        }
        local_17c0 = (Lf_Cut_t *)(&local_17c0->Sign + lVar28);
        uVar16 = uVar16 + 1;
      } while (uVar16 != local_17e8);
    }
  }
  else {
    pGVar12 = pGVar8->pObjs;
    if ((pMux < pGVar12) || (pGVar12 + pGVar8->nObjs <= pMux)) {
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                    ,0x1d4,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    uVar16 = puVar11[(int)((ulong)((long)pMux - (long)pGVar12) >> 2) * -0x55555555];
    if ((int)uVar16 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                    ,0x130,"int Abc_LitIsCompl(int)");
    }
    if ((int)uVar34 < 0) goto LAB_00733dcd;
    uVar34 = uVar34 >> 1;
    if ((p->vOffsets).nSize <= (int)uVar34) goto LAB_00733e2a;
    if ((p->vOffsets).pArray[uVar34] == -1) {
      Lf_ManPrepareSet_CutTemp._176_4_ = 2;
      Lf_ManPrepareSet_CutTemp._180_4_ = Lf_ManPrepareSet_CutTemp._180_4_ & 0x3fffff | 0x1000000;
      Lf_ManPrepareSet_CutTemp._160_8_ = 1L << ((byte)uVar34 & 0x3f);
      local_1768 = (Lf_Cut_t *)(Lf_ManPrepareSet_CutTemp + 0xa0);
      iVar26 = 1;
      Lf_ManPrepareSet_CutTemp._184_4_ = uVar34;
    }
    else {
      iVar25 = p->pPars->nCutNum;
      local_1768 = Lf_ManFetchSet(p,uVar34);
      if (iVar25 < 1) {
        iVar26 = 0;
      }
      else {
        iVar46 = 0;
        pLVar19 = local_1768;
        do {
          iVar26 = iVar46;
          if (0xfeffffff < *(uint *)&pLVar19->field_0x14) break;
          pLVar19 = (Lf_Cut_t *)(&pLVar19->Sign + p->nCutWords);
          iVar46 = iVar46 + 1;
          iVar26 = iVar25;
        } while (iVar25 != iVar46);
      }
    }
    uVar16 = uVar16 & 1;
    p->CutCount[0] = (double)(int)(local_17f4 * local_17e8 * iVar26) + p->CutCount[0];
    if ((int)local_17e8 < 1) {
      pLVar19 = (Lf_Cut_t *)0x0;
    }
    else {
      uVar34 = 0;
      iVar25 = 1 << ((char)uVar5 - 6U & 0x1f);
      if ((int)uVar5 < 7) {
        iVar25 = 1;
      }
      pLVar19 = (Lf_Cut_t *)0x0;
      pLVar20 = local_17c0;
      do {
        if (((int)(uint)(byte)pLVar20->field_0x17 <= (int)uVar5) && (0 < local_17f4)) {
          iVar46 = 0;
          pLVar52 = local_1770;
          do {
            if (((int)(uint)(byte)pLVar52->field_0x17 <= (int)uVar5) && (0 < iVar26)) {
              iVar49 = 0;
              pLVar21 = local_1768;
LAB_007330ea:
              if (((int)(uint)(byte)pLVar21->field_0x17 <= (int)uVar5) &&
                 (uVar22 = pLVar52->Sign | pLVar20->Sign | pLVar21->Sign,
                 uVar22 = uVar22 - (uVar22 >> 1 & 0x5555555555555555),
                 uVar22 = (uVar22 >> 2 & 0x3333333333333333) + (uVar22 & 0x3333333333333333),
                 pLVar19 = pLVar21,
                 (byte)(((uVar22 >> 4) + uVar22 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) <=
                 uVar5)) {
                p->CutCount[1] = p->CutCount[1] + 1.0;
                pCutR = pCutsR[(int)uVar33];
                bVar23 = pLVar20->field_0x17;
                bVar2 = pLVar52->field_0x17;
                bVar3 = pLVar21->field_0x17;
                bVar24 = 0;
                iVar17 = 0;
                uVar22 = 0;
                uVar18 = 0;
                uVar41 = 0;
                uVar48 = 0;
                while( true ) {
                  iVar47 = 1000000000;
                  iVar37 = 1000000000;
                  if (uVar48 != bVar23) {
                    iVar37 = *(int *)((long)&pLVar20[1].Sign + (ulong)uVar48 * 4);
                  }
                  if (uVar41 != bVar2) {
                    iVar47 = *(int *)((long)&pLVar52[1].Sign + (ulong)uVar41 * 4);
                  }
                  iVar50 = 1000000000;
                  if (uVar18 != bVar3) {
                    iVar50 = *(int *)((long)&pLVar21[1].Sign + (ulong)uVar18 * 4);
                  }
                  iVar31 = iVar47;
                  if (iVar37 < iVar47) {
                    iVar31 = iVar37;
                  }
                  iVar53 = iVar50;
                  if (iVar31 < iVar50) {
                    iVar53 = iVar31;
                  }
                  if (iVar53 == 1000000000) {
                    pCutR->iFunc = -1;
                    *(uint *)&pCutR->field_0x14 = (*(uint *)&pCutR->field_0x14 & 0x7fffff) - iVar17;
                    uVar29 = pLVar52->Sign | pLVar20->Sign | pLVar21->Sign;
                    pCutR->Sign = uVar29;
                    if ((int)uVar33 < 1) goto LAB_0073336c;
                    uVar18 = (uint)uVar22 & 0xff;
                    uVar22 = 0;
                    goto LAB_007332c9;
                  }
                  if (uVar43 == uVar22) break;
                  *(int *)((long)&pCutR[1].Sign + uVar22 * 4) = iVar53;
                  uVar22 = uVar22 + 1;
                  uVar48 = uVar48 + (iVar37 == iVar53);
                  uVar41 = uVar41 + (iVar47 == iVar53);
                  uVar18 = uVar18 + (iVar50 <= iVar31);
                  iVar17 = iVar17 + -0x1000000;
                  bVar24 = bVar24 + 1;
                }
              }
              goto LAB_00733160;
            }
LAB_00733566:
            pLVar52 = (Lf_Cut_t *)(&pLVar52->Sign + lVar28);
            iVar46 = iVar46 + 1;
          } while (iVar46 != local_17f4);
        }
        pLVar20 = (Lf_Cut_t *)(&pLVar20->Sign + lVar28);
        uVar34 = uVar34 + 1;
      } while (uVar34 != local_17e8);
    }
    if (p->pPars->fCutGroup != 0) {
      if (pLVar19->field_0x17 != '\x01') {
        __assert_fail("pCutSave->nLeaves == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                      ,0x4fd,"void Lf_ObjMergeOrder(Lf_Man_t *, int)");
      }
      puVar11 = p->pGia->pMuxes;
      uVar34 = 0xffffffff;
      if (puVar11 != (uint *)0x0) {
        uVar18 = puVar11[(uint)iObj];
        if (uVar18 != 0) {
          if ((int)uVar18 < 0) goto LAB_00733dcd;
          uVar34 = uVar18 >> 1;
        }
      }
      if ((uint)pLVar19[1].Sign != uVar34) {
        __assert_fail("pCutSave->pLeaves[0] == Gia_ObjFaninId2(p->pGia, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                      ,0x4fe,"void Lf_ObjMergeOrder(Lf_Man_t *, int)");
      }
      if (0 < (int)local_17e8) {
        uVar34 = 0;
        do {
          if (((int)(uint)(byte)local_17c0->field_0x17 <= (int)uVar5) && (0 < local_17f4)) {
            iVar26 = 0;
            pLVar20 = local_1770;
LAB_0073364e:
            uVar18 = *(uint *)&pLVar20->field_0x14 >> 0x18;
            if ((int)uVar18 <= (int)uVar5) {
              uVar41 = p->pPars->nLutSize;
              if ((int)uVar41 <= (int)((byte)local_17c0->field_0x17 + uVar18)) {
                __assert_fail("(int)pCut0->nLeaves + (int)pCut1->nLeaves + 1 <= p->pPars->nLutSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                              ,0x502,"void Lf_ObjMergeOrder(Lf_Man_t *, int)");
              }
              p->CutCount[1] = p->CutCount[1] + 1.0;
              pLVar52 = pCutsR[(int)uVar33];
              bVar23 = local_17c0->field_0x17;
              bVar2 = pLVar20->field_0x17;
              bVar3 = pLVar19->field_0x17;
              bVar24 = 0;
              iVar25 = 0;
              uVar22 = 0;
              uVar18 = 0;
              uVar43 = 0;
              uVar48 = 0;
              while( true ) {
                iVar49 = 1000000000;
                iVar46 = 1000000000;
                if (uVar48 != bVar23) {
                  iVar46 = *(int *)((long)&local_17c0[1].Sign + (ulong)uVar48 * 4);
                }
                if ((uint)uVar43 != (uint)bVar2) {
                  iVar49 = *(int *)((long)&pLVar20[1].Sign + uVar43 * 4);
                }
                iVar17 = 1000000000;
                if (uVar18 != bVar3) {
                  iVar17 = *(int *)((long)&pLVar19[1].Sign + (ulong)uVar18 * 4);
                }
                iVar37 = iVar49;
                if (iVar46 < iVar49) {
                  iVar37 = iVar46;
                }
                iVar47 = iVar17;
                if (iVar37 < iVar17) {
                  iVar47 = iVar37;
                }
                if (iVar47 == 1000000000) {
                  pLVar52->iFunc = -1;
                  *(uint *)&pLVar52->field_0x14 =
                       (*(uint *)&pLVar52->field_0x14 & 0x7fffff) - iVar25;
                  uVar43 = pLVar20->Sign | local_17c0->Sign | pLVar19->Sign;
                  pLVar52->Sign = uVar43;
                  if ((int)uVar33 < 1) goto LAB_00733861;
                  uVar18 = (uint)uVar22 & 0xff;
                  uVar22 = 0;
                  goto LAB_007337cd;
                }
                if (uVar41 == uVar22) break;
                *(int *)((long)&pLVar52[1].Sign + uVar22 * 4) = iVar47;
                uVar22 = uVar22 + 1;
                uVar48 = uVar48 + (iVar46 == iVar47);
                uVar43 = (ulong)((uint)uVar43 + (uint)(iVar49 == iVar47));
                uVar18 = uVar18 + (iVar17 <= iVar37);
                iVar25 = iVar25 + -0x1000000;
                bVar24 = bVar24 + 1;
              }
            }
            goto LAB_0073395a;
          }
LAB_0073396a:
          local_17c0 = (Lf_Cut_t *)(&local_17c0->Sign + lVar28);
          uVar34 = uVar34 + 1;
        } while (uVar34 != local_17e8);
      }
    }
  }
  if (((int)uVar33 < 1) || ((int)uVar4 <= (int)uVar33)) {
    __assert_fail("nCutsR > 0 && nCutsR < nCutNum",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                  ,0x536,"void Lf_ObjMergeOrder(Lf_Man_t *, int)");
  }
  if ((uVar33 != 1) && (pCutsR[1]->Delay < pCutsR[0]->Delay)) {
    __assert_fail("nCutsR == 1 || pCutsR[0]->Delay <= pCutsR[1]->Delay",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                  ,0x539,"void Lf_ObjMergeOrder(Lf_Man_t *, int)");
  }
  *(ulong *)pLVar38->Cut = *(ulong *)pLVar38->Cut & 0xfffffffefffffffe;
  iVar26 = Lf_MemSaveCut(&p->vStoreNew,pCutsR[0],iObj);
  pLVar19 = pCutsR[1];
  *(ulong *)pLVar38->Cut = CONCAT44(iVar26 * 2,iVar26 * 2) | *(ulong *)pLVar38->Cut & DAT_009e4cd0;
  iVar26 = pCutsR[0]->Delay;
  pLVar38->Delay[1] = iVar26;
  pLVar38->Delay[0] = iVar26;
  fVar1 = pCutsR[0]->Flow;
  pLVar38->Flow[1] = fVar1;
  pLVar38->Flow[0] = fVar1;
  p->nCutCounts[(byte)pCutsR[0]->field_0x17] = p->nCutCounts[(byte)pCutsR[0]->field_0x17] + 1;
  p->nCutEqual = p->nCutEqual + 1;
  p->CutCount[3] = (double)(int)uVar33 + p->CutCount[3];
  if ((uVar33 == 1) || (pCutsR[0]->Flow <= pCutsR[1]->Flow + 0.005)) {
    uVar22 = 0;
  }
  else {
    iVar26 = Lf_MemSaveCut(&p->vStoreNew,pCutsR[1],iObj);
    pLVar38->Cut[1] = (Lf_Plc_t)(((uint)pLVar38->Cut[1] & 1) + iVar26 * 2);
    pLVar38->Delay[1] = pLVar19->Delay;
    pLVar38->Flow[1] = pLVar19->Flow;
    p->nCutCounts[(byte)pLVar19->field_0x17] = p->nCutCounts[(byte)pLVar19->field_0x17] + 1;
    p->nCutEqual = p->nCutEqual + -1;
    uVar22 = (ulong)((pLVar19->field_0x16 & 0x40) == 0);
  }
  if (p->pPars->fUseMux7 != 0) {
    pGVar8 = p->pGia;
    puVar11 = pGVar8->pMuxes;
    if ((puVar11 != (uint *)0x0) && (puVar11[(uint)iObj] != 0)) {
      if (pGVar8->nObjs <= iObj) {
LAB_00733f41:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (puVar11[(uint)iObj] == 0) {
        __assert_fail("Gia_ObjIsMux(p->pGia, pMux)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                      ,0x245,"Lf_Cut_t *Lf_MemLoadMuxCut(Lf_Man_t *, int, Lf_Cut_t *)");
      }
      Lf_ObjCutMux_CutSet._16_4_ = -(uint)(p->pPars->fCutMin == 0) | 4;
      Lf_ObjCutMux_CutSet._24_4_ = iObj - (*(uint *)(pGVar8->pObjs + (uint)iObj) & 0x1fffffff);
      Lf_ObjCutMux_CutSet._28_4_ =
           iObj - (*(uint *)&pGVar8->pObjs[(uint)iObj].field_0x4 & 0x1fffffff);
      uVar5 = puVar11[(uint)iObj];
      if (uVar5 == 0) {
        Lf_ObjCutMux_CutSet._32_4_ = 0xffffffff;
      }
      else {
        if ((int)uVar5 < 0) {
LAB_00733dcd:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        Lf_ObjCutMux_CutSet._32_4_ = uVar5 >> 1;
      }
      Lf_ObjCutMux_CutSet._20_4_ = Lf_ObjCutMux_CutSet._20_4_ & 0x7fffff | 0x3800000;
      Lf_CutParams(p,(Lf_Cut_t *)Lf_ObjCutMux_CutSet,local_17d4,FlowRefs,pMux);
      pLVar38->Delay[2] = Lf_ObjCutMux_CutSet._8_4_;
      pLVar38->Flow[2] = (float)Lf_ObjCutMux_CutSet._12_4_;
    }
  }
  if (p->fUseEla != 0) {
    *(byte *)(pLVar38->Cut + uVar22) = *(byte *)(pLVar38->Cut + uVar22) | 1;
    if (iObj < (p->vOffsets).nSize) {
      iVar26 = (p->vOffsets).pArray[(uint)iObj];
      if ((-1 < (long)iVar26) && (iVar26 < (p->vMapRefs).nSize)) {
        if (0 < (p->vMapRefs).pArray[iVar26]) {
          Lf_CutRef_rec(p,pCutsR[uVar22]);
        }
        goto LAB_00733c75;
      }
    }
LAB_00733e2a:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
LAB_00733c75:
  if (pMux->Value != 0) {
    pLVar19 = Lf_ManFetchSet(p,iObj);
    pLVar19 = pLVar19 + 1;
    uVar22 = 0;
    do {
      uVar5 = *(uint *)&pLVar19[-1].field_0x14;
      if ((uVar5 >> 0x17 & 1) != 0) {
        __assert_fail("!pCut0->fMux7",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                      ,0x56a,"void Lf_ObjMergeOrder(Lf_Man_t *, int)");
      }
      if (uVar22 < uVar33) {
        memcpy(pLVar19 + -1,pCutsR[uVar22],lVar28 * 8);
      }
      else if (((uVar22 == uVar33) && (0x1ffffff < *(uint *)&pCutsR[0]->field_0x14)) &&
              ((uVar33 == 1 || (0x1ffffff < *(uint *)&pCutsR[1]->field_0x14)))) {
        pLVar19[-1].iFunc = 2;
        *(uint *)&pLVar19[-1].field_0x14 = uVar5 & 0x3fffff | 0x1000000;
        *(int *)&pLVar19->Sign = iObj;
        pLVar19[-1].Sign = 1L << ((byte)iObj & 0x3f);
      }
      else {
        *(uint *)&pLVar19[-1].field_0x14 = uVar5 | 0xff000000;
      }
      uVar22 = uVar22 + 1;
      pLVar19 = (Lf_Cut_t *)(&pLVar19->Sign + lVar28);
    } while (uVar4 != uVar22);
  }
  return;
LAB_007332c9:
  do {
    pLVar14 = pCutsR[uVar22];
    uVar41 = *(uint *)&pLVar14->field_0x14 >> 0x18;
    if ((uVar41 <= uVar18) && ((pLVar14->Sign & ~uVar29) == 0)) {
      if (uVar18 == uVar41) {
        if (iVar17 == 0) goto LAB_00733160;
        uVar42 = 0;
        while (*(int *)((long)&pCutR[1].Sign + uVar42 * 4) ==
               *(int *)((long)&pLVar14[1].Sign + uVar42 * 4)) {
          uVar42 = uVar42 + 1;
          if (bVar24 == uVar42) goto LAB_00733160;
        }
      }
      else {
        if (uVar18 <= uVar41) goto LAB_00733d70;
        if (*(uint *)&pLVar14->field_0x14 < 0x1000000) goto LAB_00733160;
        uVar42 = 0;
        uVar48 = 0;
        do {
          iVar37 = *(int *)((long)&pLVar14[1].Sign + (long)(int)uVar48 * 4);
          iVar47 = *(int *)((long)&pCutR[1].Sign + uVar42 * 4);
          if (iVar37 < iVar47) break;
          if ((iVar47 == iVar37) && (uVar48 = uVar48 + 1, uVar48 == uVar41)) goto LAB_00733160;
          uVar42 = uVar42 + 1;
        } while (bVar24 != uVar42);
      }
    }
    uVar22 = uVar22 + 1;
  } while (uVar22 != uVar33);
LAB_0073336c:
  p->CutCount[2] = p->CutCount[2] + 1.0;
  if ((p->pPars->fCutMin != 0) &&
     (iVar17 = Lf_CutComputeTruthMux(p,pLVar20,pLVar52,pLVar21,uVar32,fCompl1,uVar16,pCutR),
     iVar17 != 0)) {
    if (*(uint *)&pCutR->field_0x14 < 0x1000000) {
      uVar22 = 0;
    }
    else {
      uVar29 = 0;
      uVar22 = 0;
      do {
        uVar22 = uVar22 | 1L << ((ulong)*(byte *)((long)&pCutR[1].Sign + uVar29 * 4) & 0x3f);
        uVar29 = uVar29 + 1;
      } while (*(uint *)&pCutR->field_0x14 >> 0x18 != uVar29);
    }
    pCutR->Sign = uVar22;
  }
  uVar18 = p->pPars->nLutSizeMux;
  if ((uVar18 != 0) && (uVar18 == (byte)pCutR->field_0x17)) {
    if (pCutR->iFunc < 0) goto LAB_00733dcd;
    pVVar15 = p->vTtMem;
    uVar41 = (uint)pCutR->iFunc >> 1;
    if (pVVar15->nEntries <= (int)uVar41) goto LAB_00733dec;
    iVar17 = Lf_ManFindCofVar(pVVar15->ppPages[uVar41 >> ((byte)pVVar15->LogPageSze & 0x1f)] +
                              (ulong)(uVar41 & pVVar15->PageMask) * (long)pVVar15->nEntrySize,iVar25
                              ,uVar18);
    if (iVar17 == -1) goto LAB_00733160;
  }
  Lf_CutParams(p,pCutR,local_17d4,FlowRefs,pMux);
  uVar33 = Lf_SetAddCut(pCutsR,uVar33,uVar4);
LAB_00733160:
  pLVar21 = (Lf_Cut_t *)(&pLVar21->Sign + lVar28);
  iVar49 = iVar49 + 1;
  if (iVar49 == iVar26) goto LAB_00733566;
  goto LAB_007330ea;
LAB_007337cd:
  do {
    pLVar21 = pCutsR[uVar22];
    uVar41 = *(uint *)&pLVar21->field_0x14 >> 0x18;
    if ((uVar41 <= uVar18) && ((pLVar21->Sign & ~uVar43) == 0)) {
      if (uVar18 == uVar41) {
        if (iVar25 == 0) goto LAB_0073395a;
        uVar29 = 0;
        while (*(int *)((long)&pLVar52[1].Sign + uVar29 * 4) ==
               *(int *)((long)&pLVar21[1].Sign + uVar29 * 4)) {
          uVar29 = uVar29 + 1;
          if (bVar24 == uVar29) goto LAB_0073395a;
        }
      }
      else {
        if (uVar18 <= uVar41) {
LAB_00733d70:
          __assert_fail("nSizeB > nSizeC",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                        ,0x329,"int Lf_SetCutIsContainedOrder(Lf_Cut_t *, Lf_Cut_t *)");
        }
        if (*(uint *)&pLVar21->field_0x14 < 0x1000000) goto LAB_0073395a;
        uVar29 = 0;
        uVar48 = 0;
        do {
          iVar46 = *(int *)((long)&pLVar21[1].Sign + (long)(int)uVar48 * 4);
          iVar49 = *(int *)((long)&pLVar52[1].Sign + uVar29 * 4);
          if (iVar46 < iVar49) break;
          if ((iVar49 == iVar46) && (uVar48 = uVar48 + 1, uVar48 == uVar41)) goto LAB_0073395a;
          uVar29 = uVar29 + 1;
        } while (bVar24 != uVar29);
      }
    }
    uVar22 = uVar22 + 1;
  } while (uVar22 != uVar33);
LAB_00733861:
  p->CutCount[2] = p->CutCount[2] + 1.0;
  if ((p->pPars->fCutMin != 0) &&
     (iVar25 = Lf_CutComputeTruthMux(p,local_17c0,pLVar20,pLVar19,uVar32,fCompl1,uVar16,pLVar52),
     iVar25 != 0)) {
    if (*(uint *)&pLVar52->field_0x14 < 0x1000000) {
      uVar22 = 0;
    }
    else {
      uVar43 = 0;
      uVar22 = 0;
      do {
        uVar22 = uVar22 | 1L << ((ulong)*(byte *)((long)&pLVar52[1].Sign + uVar43 * 4) & 0x3f);
        uVar43 = uVar43 + 1;
      } while (*(uint *)&pLVar52->field_0x14 >> 0x18 != uVar43);
    }
    pLVar52->Sign = uVar22;
  }
  Lf_CutParams(p,pLVar52,local_17d4,FlowRefs,pMux);
  uVar33 = Lf_SetAddCut(pCutsR,uVar33,uVar4);
LAB_0073395a:
  pLVar20 = (Lf_Cut_t *)(&pLVar20->Sign + lVar28);
  iVar26 = iVar26 + 1;
  if (iVar26 == local_17f4) goto LAB_0073396a;
  goto LAB_0073364e;
}

Assistant:

void Lf_ObjMergeOrder( Lf_Man_t * p, int iObj )
{
    word CutSet[LF_CUT_MAX][LF_CUT_WORDS] = {{0}};
    Lf_Cut_t * pCutSet0, * pCutSet1, * pCutSet2, * pCut0, * pCut1, * pCut2;
    Lf_Cut_t * pCutSet = (Lf_Cut_t *)CutSet, * pCutsR[LF_CUT_MAX];
    Gia_Obj_t * pObj = Gia_ManObj(p->pGia, iObj);
    Lf_Bst_t * pBest = Lf_ObjReadBest(p, iObj);
    float FlowRefs = Lf_ObjFlowRefs(p, iObj);
    int Required   = Lf_ObjRequired(p, iObj);
    int nLutSize   = p->pPars->fCutGroup ? p->pPars->nLutSize/2 : p->pPars->nLutSize;
    int nCutNum    = p->pPars->nCutNum;
    int nCutWords  = p->nCutWords;
    int fComp0     = Gia_ObjFaninC0(pObj);
    int fComp1     = Gia_ObjFaninC1(pObj);
    int nCuts0     = Lf_ManPrepareSet( p, Gia_ObjFaninId0(pObj, iObj), 0, &pCutSet0 );
    int nCuts1     = Lf_ManPrepareSet( p, Gia_ObjFaninId1(pObj, iObj), 1, &pCutSet1 );
    int iSibl      = Gia_ObjSibl(p->pGia, iObj);
    int i, k, n, iCutUsed, nCutsR = 0;
    float Value1 = -1, Value2 = -1;
    assert( !Gia_ObjIsBuf(pObj) );
    Lf_CutSetForEachCut( nCutWords, pCutSet, pCut0, i, nCutNum )
        pCutsR[i] = pCut0;
    if ( p->Iter )
    {
        assert( nCutsR == 0 );
        // load cuts
        Lf_MemLoadCut( &p->vStoreOld, pBest->Cut[0].Handle, iObj, pCutsR[0], p->pPars->fCutMin, 1 );
        if ( Lf_BestDiffCuts(pBest) )
            Lf_MemLoadCut( &p->vStoreOld, pBest->Cut[1].Handle, iObj, pCutsR[1], p->pPars->fCutMin, 1 );
        // deref the cut
        if ( p->fUseEla && Lf_ObjMapRefNum(p, iObj) > 0 )
            Value1 = Lf_CutDeref_rec( p, pCutsR[Lf_BestIndex(pBest)] );
        // update required times
        if ( Required == ABC_INFINITY )//&& !p->fUseEla )
            Required = Lf_CutRequired( p, pCutsR[0] );
        // compute parameters
        Lf_CutParams( p, pCutsR[nCutsR++], Required, FlowRefs, pObj );
        if ( Lf_BestDiffCuts(pBest) )
        {
            assert( nCutsR == 1 );
            Lf_CutParams( p, pCutsR[nCutsR], Required, FlowRefs, pObj );
            nCutsR = Lf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
        if ( pCutsR[0]->fLate )
            p->nTimeFails++;
    }
    if ( iSibl )
    {
        Gia_Obj_t * pObjE = Gia_ObjSiblObj(p->pGia, iObj);
        int fCompE = Gia_ObjPhase(pObj) ^ Gia_ObjPhase(pObjE);
        int nCutsE = Lf_ManPrepareSet( p, iSibl, 2, &pCutSet2 );
        Lf_CutSetForEachCut( nCutWords, pCutSet2, pCut2, n, nCutsE )
        {
            if ( pCut2->pLeaves[0] == iSibl )
                continue;
            Lf_CutCopy( pCutsR[nCutsR], pCut2, nCutWords );
            if ( pCutsR[nCutsR]->iFunc >= 0 )
                pCutsR[nCutsR]->iFunc = Abc_LitNotCond( pCutsR[nCutsR]->iFunc, fCompE );
            Lf_CutParams( p, pCutsR[nCutsR], Required, FlowRefs, pObj );
            nCutsR = Lf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    if ( Gia_ObjIsMuxId(p->pGia, iObj) )
    {
        Lf_Cut_t * pCutSave = NULL;
        int fComp2 = Gia_ObjFaninC2(p->pGia, pObj);
        int nCuts2 = Lf_ManPrepareSet( p, Gia_ObjFaninId2(p->pGia, iObj), 2, &pCutSet2 );
        p->CutCount[0] += nCuts0 * nCuts1 * nCuts2;
        Lf_CutSetForEachCut( nCutWords, pCutSet0, pCut0, i, nCuts0 ) if ( (int)pCut0->nLeaves <= nLutSize )
        Lf_CutSetForEachCut( nCutWords, pCutSet1, pCut1, k, nCuts1 ) if ( (int)pCut1->nLeaves <= nLutSize )
        Lf_CutSetForEachCut( nCutWords, pCutSet2, pCut2, n, nCuts2 ) if ( (int)pCut2->nLeaves <= nLutSize )
        {
            pCutSave = pCut2;
            if ( Lf_CutCountBits(pCut0->Sign | pCut1->Sign | pCut2->Sign) > nLutSize )
                continue;
            p->CutCount[1]++; 
            if ( !Lf_CutMergeOrderMux(pCut0, pCut1, pCut2, pCutsR[nCutsR], nLutSize) )
                continue;
            if ( Lf_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
            p->CutCount[2]++;
            if ( p->pPars->fCutMin && Lf_CutComputeTruthMux(p, pCut0, pCut1, pCut2, fComp0, fComp1, fComp2, pCutsR[nCutsR]) )
                pCutsR[nCutsR]->Sign = Lf_CutGetSign(pCutsR[nCutsR]);
            if ( p->pPars->nLutSizeMux && p->pPars->nLutSizeMux == (int)pCutsR[nCutsR]->nLeaves && 
                Lf_ManFindCofVar(Lf_CutTruth(p,pCutsR[nCutsR]), Abc_Truth6WordNum(nLutSize), pCutsR[nCutsR]->nLeaves) == -1 )
                continue;
            Lf_CutParams( p, pCutsR[nCutsR], Required, FlowRefs, pObj );
            nCutsR = Lf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
        if ( p->pPars->fCutGroup )
        {
            assert( pCutSave->nLeaves == 1 );
            assert( pCutSave->pLeaves[0] == Gia_ObjFaninId2(p->pGia, iObj) );
            Lf_CutSetForEachCut( nCutWords, pCutSet0, pCut0, i, nCuts0 ) if ( (int)pCut0->nLeaves <= nLutSize )
            Lf_CutSetForEachCut( nCutWords, pCutSet1, pCut1, k, nCuts1 ) if ( (int)pCut1->nLeaves <= nLutSize )
            {
                assert( (int)pCut0->nLeaves + (int)pCut1->nLeaves + 1 <= p->pPars->nLutSize );
    //            if ( Lf_CutCountBits(pCut0->Sign | pCut1->Sign | pCutSave->Sign) > p->pPars->nLutSize )
    //                continue;
                p->CutCount[1]++; 
                if ( !Lf_CutMergeOrderMux(pCut0, pCut1, pCutSave, pCutsR[nCutsR], p->pPars->nLutSize) )
                    continue;
                if ( Lf_SetLastCutIsContained(pCutsR, nCutsR) )
                    continue;
                p->CutCount[2]++;
                if ( p->pPars->fCutMin && Lf_CutComputeTruthMux(p, pCut0, pCut1, pCutSave, fComp0, fComp1, fComp2, pCutsR[nCutsR]) )
                    pCutsR[nCutsR]->Sign = Lf_CutGetSign(pCutsR[nCutsR]);
    //            if ( p->pPars->nLutSizeMux && p->pPars->nLutSizeMux == (int)pCutsR[nCutsR]->nLeaves && 
    //                Lf_ManFindCofVar(Lf_CutTruth(p,pCutsR[nCutsR]), Abc_Truth6WordNum(nLutSize), pCutsR[nCutsR]->nLeaves) == -1 )
    //                continue;
                Lf_CutParams( p, pCutsR[nCutsR], Required, FlowRefs, pObj );
                nCutsR = Lf_SetAddCut( pCutsR, nCutsR, nCutNum );
            }
        }
    }
    else
    {
        int fIsXor = Gia_ObjIsXor(pObj);
        p->CutCount[0] += nCuts0 * nCuts1;
        Lf_CutSetForEachCut( nCutWords, pCutSet0, pCut0, i, nCuts0 ) if ( (int)pCut0->nLeaves <= nLutSize )
        Lf_CutSetForEachCut( nCutWords, pCutSet1, pCut1, k, nCuts1 ) if ( (int)pCut1->nLeaves <= nLutSize )
        {
            if ( (int)(pCut0->nLeaves + pCut1->nLeaves) > nLutSize && Lf_CutCountBits(pCut0->Sign | pCut1->Sign) > nLutSize )
                continue;
            p->CutCount[1]++; 
            if ( !Lf_CutMergeOrder(pCut0, pCut1, pCutsR[nCutsR], nLutSize) )
                continue;
            if ( Lf_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
            p->CutCount[2]++;
            if ( p->pPars->fCutMin && Lf_CutComputeTruth(p, pCut0, pCut1, fComp0, fComp1, pCutsR[nCutsR], fIsXor) )
                pCutsR[nCutsR]->Sign = Lf_CutGetSign(pCutsR[nCutsR]);
            if ( p->pPars->nLutSizeMux && p->pPars->nLutSizeMux == (int)pCutsR[nCutsR]->nLeaves && 
                Lf_ManFindCofVar(Lf_CutTruth(p,pCutsR[nCutsR]), Abc_Truth6WordNum(nLutSize), pCutsR[nCutsR]->nLeaves) == -1 )
                continue;
            Lf_CutParams( p, pCutsR[nCutsR], Required, FlowRefs, pObj );
            nCutsR = Lf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    // debug printout
    if ( 0 )
    {
        printf( "*** Obj = %d  FlowRefs = %.2f  MapRefs = %2d  Required = %2d\n", iObj, FlowRefs, Lf_ObjMapRefNum(p, iObj), Required );
        for ( i = 0; i < nCutsR; i++ )
            Lf_CutPrint( p, pCutsR[i] );
        printf( "\n" );
    }
    // verify
    assert( nCutsR > 0 && nCutsR < nCutNum );
//    assert( Lf_SetCheckArray(pCutsR, nCutsR) );
    // delay cut
    assert( nCutsR == 1 || pCutsR[0]->Delay <= pCutsR[1]->Delay );
    pBest->Cut[0].fUsed = pBest->Cut[1].fUsed = 0;
    pBest->Cut[0].Handle = pBest->Cut[1].Handle = Lf_MemSaveCut(&p->vStoreNew, pCutsR[0], iObj);
    pBest->Delay[0] = pBest->Delay[1] = pCutsR[0]->Delay;
    pBest->Flow[0] = pBest->Flow[1] = pCutsR[0]->Flow;
    p->nCutCounts[pCutsR[0]->nLeaves]++;
    p->CutCount[3] += nCutsR;
    p->nCutEqual++;
    // area cut
    iCutUsed = 0;
    if ( nCutsR > 1 && pCutsR[0]->Flow > pCutsR[1]->Flow + LF_EPSILON )//&& !pCutsR[1]->fLate ) // can remove !fLate
    {
        pBest->Cut[1].Handle = Lf_MemSaveCut(&p->vStoreNew, pCutsR[1], iObj);
        pBest->Delay[1] = pCutsR[1]->Delay;
        pBest->Flow[1] = pCutsR[1]->Flow;
        p->nCutCounts[pCutsR[1]->nLeaves]++;
        p->nCutEqual--;
        if ( !pCutsR[1]->fLate )
            iCutUsed = 1;
    }
    // mux cut
    if ( p->pPars->fUseMux7 && Gia_ObjIsMuxId(p->pGia, iObj) )
    {
        pCut2 = Lf_ObjCutMux( p, iObj );
        Lf_CutParams( p, pCut2, Required, FlowRefs, pObj );
        pBest->Delay[2] = pCut2->Delay;
        pBest->Flow[2] = pCut2->Flow;
        // update area value of the best area cut
//        if ( !pCut2->fLate )
//            pBest->Flow[1] = Abc_MinFloat( pBest->Flow[1], pBest->Flow[2] );
    }
    // reference resulting cut
    if ( p->fUseEla )
    {
        pBest->Cut[iCutUsed].fUsed = 1;
        if ( Lf_ObjMapRefNum(p, iObj) > 0 )
            Value2 = Lf_CutRef_rec( p, pCutsR[iCutUsed] );
//        if ( Value1 < Value2 )
//            printf( "ELA degradated cost at node %d from %d to %d.\n", iObj, Value1, Value2 ), fflush(stdout);
//        assert( Value1 >= Value2 );
//        if ( Value1 != -1 )
//            printf( "%.2f -> %.2f    ", Value1, Value2 );
    }
    if ( pObj->Value == 0 )
        return;
    // store the cutset
    pCutSet = Lf_ManFetchSet(p, iObj);
    Lf_CutSetForEachCut( nCutWords, pCutSet, pCut0, i, nCutNum )
    {
        assert( !pCut0->fMux7 );
        if ( i < nCutsR )
            Lf_CutCopy( pCut0, pCutsR[i], nCutWords );
        else if ( i == nCutsR && pCutsR[0]->nLeaves > 1 && (nCutsR == 1 || pCutsR[1]->nLeaves > 1) )
            Lf_CutCreateUnit( pCut0, iObj );
        else
            pCut0->nLeaves = LF_NO_LEAF;
    }
}